

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quarticSolver.cpp
# Opt level: O3

vector<double,_std::allocator<double>_> *
eigenSolver(vector<double,_std::allocator<double>_> *__return_storage_ptr__,
           vector<double,_std::allocator<double>_> *coeffA)

{
  iterator __position;
  ostream *poVar1;
  char *__function;
  long lVar2;
  pointer pdVar3;
  long lVar4;
  long lVar5;
  PolynomialSolver<double,_1> *pPVar6;
  VectorXd coeff;
  PolynomialSolver<double,__1> psolve;
  Matrix<double,__1,_1,_0,__1,_1> local_140;
  PolynomialSolver<double,_1> *local_130;
  long local_128;
  pointer local_118;
  long lStack_110;
  EigenSolver<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> local_108;
  
  if ((coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_start ==
      (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish) {
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    return __return_storage_ptr__;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"eigen solver begin",0x12);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
  std::ostream::put(' ');
  std::ostream::flush();
  local_118 = (coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start;
  lStack_110 = (long)(coeffA->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)local_118 >> 3;
  if (lStack_110 < 0) {
    __function = 
    "Eigen::MapBase<Eigen::Map<const Eigen::Matrix<double, -1, 1>>>::MapBase(PointerType, Index) [Derived = Eigen::Map<const Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  else {
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::Map<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::Stride<0,0>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_140,
               (DenseBase<Eigen::Map<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>
                *)&local_118);
    local_118 = (pointer)0x0;
    lStack_110 = 0;
    Eigen::EigenSolver<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::EigenSolver(&local_108);
    Eigen::PolynomialSolver<double,-1>::compute<Eigen::Matrix<double,_1,1,0,_1,1>>
              ((PolynomialSolver<double,_1> *)&local_118,&local_140);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Complex roots: ",0xf);
    local_130 = (PolynomialSolver<double,_1> *)&local_118;
    poVar1 = Eigen::operator<<((ostream *)&std::cout,
                               (DenseBase<Eigen::Transpose<const_Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>_>
                                *)&local_130);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (lStack_110 < 1) {
      pdVar3 = (pointer)0x0;
      pPVar6 = (PolynomialSolver<double,_1> *)0x0;
    }
    else {
      lVar5 = 8;
      lVar2 = 0;
      lVar4 = lStack_110;
      do {
        if (ABS(*(double *)((long)local_118 + lVar5)) < 1e-12) {
          local_130 = *(PolynomialSolver<double,_1> **)((long)local_118 + lVar5 + -8);
          __position._M_current =
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
          if (__position._M_current ==
              (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                      (__return_storage_ptr__,__position,(double *)&local_130);
            lVar4 = lStack_110;
          }
          else {
            *__position._M_current = (double)local_130;
            (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish = __position._M_current + 1;
          }
        }
        lVar2 = lVar2 + 1;
        lVar5 = lVar5 + 0x10;
      } while (lVar2 < lVar4);
      pPVar6 = (PolynomialSolver<double,_1> *)
               (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_start;
      pdVar3 = (__return_storage_ptr__->super__Vector_base<double,_std::allocator<double>_>)._M_impl
               .super__Vector_impl_data._M_finish;
    }
    lVar4 = (long)pdVar3 - (long)pPVar6 >> 3;
    if (-1 < lVar4) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Real roots: ",0xc);
      local_130 = pPVar6;
      local_128 = lVar4;
      poVar1 = Eigen::operator<<((ostream *)&std::cout,
                                 (DenseBase<Eigen::Transpose<Eigen::Map<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::Stride<0,_0>_>_>_>
                                  *)&local_130);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
      std::ostream::put((char)poVar1);
      std::ostream::flush();
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"eigen solver end",0x10);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + ' ');
      std::ostream::put(' ');
      std::ostream::flush();
      free(local_108.m_tmp.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_108.m_matT.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_temp.
           super_PlainObjectBase<Eigen::Matrix<double,_1,__1,_1,_1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_hCoeffs.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_hess.m_matrix.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_workspaceVector.
           super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_matU.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_realSchur.m_matT.
           super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data);
      free(local_108.m_eivalues.
           super_PlainObjectBase<Eigen::Matrix<std::complex<double>,__1,_1,_0,__1,_1>_>.m_storage.
           m_data);
      free(local_108.m_eivec.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
           m_storage.m_data);
      free(local_118);
      free(local_140.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
          );
      return __return_storage_ptr__;
    }
    __function = 
    "Eigen::MapBase<Eigen::Map<Eigen::Matrix<double, -1, 1>>, 0>::MapBase(PointerType, Index) [Derived = Eigen::Map<Eigen::Matrix<double, -1, 1>>, Level = 0]"
    ;
  }
  __assert_fail("vecSize >= 0",
                "/usr/include/eigen3/unsupported/Eigen/../../Eigen/src/Core/MapBase.h",0xa6,
                __function);
}

Assistant:

std::vector<double> eigenSolver(const std::vector<double>& coeffA)
{
    if (coeffA.empty())
        return {};

    std::cout<<"eigen solver begin"<<std::endl;
    using namespace Eigen;
    VectorXd coeff =  VectorXd::Map(coeffA.data(), coeffA.size());

    Eigen::PolynomialSolver<double, Eigen::Dynamic> psolve(coeff);
    std::cout << "Complex roots: " << psolve.roots().transpose() << std::endl;
    std::vector<double> realRoots;
    psolve.realRoots( realRoots );
    Map<VectorXd> mapRR(realRoots.data(), realRoots.size());
    std::cout << "Real roots: " << mapRR.transpose() << std::endl;
    std::cout<<"eigen solver end"<<std::endl;
    return realRoots;
}